

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  double *pdVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  
  pFVar9 = (this->left_->fadexpr_).left_;
  pFVar10 = (this->left_->fadexpr_).right_;
  pdVar12 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar12 = (pFVar9->dx_).ptr_to_data + i;
  }
  pdVar11 = &pFVar10->defaultVal;
  if ((pFVar10->dx_).num_elts != 0) {
    pdVar11 = (pFVar10->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar12;
  dVar2 = *pdVar11;
  dVar3 = pFVar9->val_;
  dVar4 = pFVar10->val_;
  dVar13 = sin(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar9 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pdVar12 = &pFVar9->defaultVal;
  if ((pFVar9->dx_).num_elts != 0) {
    pdVar12 = (pFVar9->dx_).ptr_to_data + i;
  }
  pFVar10 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  pdVar11 = &pFVar10->defaultVal;
  if ((pFVar10->dx_).num_elts != 0) {
    pdVar11 = (pFVar10->dx_).ptr_to_data + i;
  }
  dVar5 = pFVar10->val_;
  dVar6 = pFVar9->val_;
  dVar7 = *pdVar11;
  dVar8 = *pdVar12;
  dVar14 = cos(dVar5 * dVar6);
  return dVar14 * (dVar8 * dVar5 + dVar7 * dVar6) *
         ((this->left_->fadexpr_).left_)->val_ * ((this->left_->fadexpr_).right_)->val_ +
         dVar13 * (dVar1 * dVar4 + dVar2 * dVar3);
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}